

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralMember::~IfcStructuralMember(IfcStructuralMember *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x28 =
       0x930868;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x10 =
       0x9308e0;
  *(undefined8 *)
   &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x930890;
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xc0 =
       0x9308b8;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xd0;
  if (puVar1 != &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xe0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x28 =
       0x930980;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x10 =
       0x9309a8;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x88;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)puVar1 !=
      &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x60;
  if (puVar1 != &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x38;
  if (puVar1 != &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x48) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

IfcStructuralMember() : Object("IfcStructuralMember") {}